

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O1

void anon_unknown.dwarf_31ecc4::fillPixels(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  char cVar5;
  ushort uVar6;
  uint uVar7;
  float fVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  ulong local_60;
  
  if (0 < h) {
    lVar12 = 0;
    local_60 = 0;
    do {
      if (0 < w) {
        dVar2 = (double)(int)local_60;
        uVar10 = 0;
        do {
          lVar11 = pixels->_sizeY;
          dVar3 = (double)(int)uVar10;
          pRVar1 = pixels->_data;
          dVar4 = sin(dVar3 * 0.1 + dVar2 * 0.1);
          fVar13 = (float)(dVar4 * 0.5 + 0.5);
          fVar8 = ABS(fVar13);
          uVar6 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar7 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar6 = uVar6 | (ushort)(uVar7 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar7 << (cVar5 + 0xa2U & 0x1f))) {
              uVar6 = uVar6 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar6 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar6;
            }
            else {
              uVar6 = uVar6 | 0x7c00;
            }
          }
          else {
            uVar6 = uVar6 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar7 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar6 = uVar6 | (ushort)uVar7 | (ushort)(uVar7 == 0);
            }
          }
          lVar11 = lVar11 * lVar12;
          *(ushort *)((long)&pRVar1[uVar10].r._h + lVar11) = uVar6;
          dVar4 = sin(dVar3 * 0.1 + dVar2 * 0.2);
          fVar13 = (float)(dVar4 * 0.5 + 0.5);
          fVar8 = ABS(fVar13);
          uVar6 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar7 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar6 = uVar6 | (ushort)(uVar7 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar7 << (cVar5 + 0xa2U & 0x1f))) {
              uVar6 = uVar6 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar6 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar6;
            }
            else {
              uVar6 = uVar6 | 0x7c00;
            }
          }
          else {
            uVar6 = uVar6 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar7 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar6 = uVar6 | (ushort)uVar7 | (ushort)(uVar7 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar10].g._h + lVar11) = uVar6;
          dVar3 = sin(dVar3 * 0.1 + dVar2 * 0.3);
          fVar13 = (float)(dVar3 * 0.5 + 0.5);
          fVar8 = ABS(fVar13);
          uVar7 = (uint)fVar13 >> 0x10 & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | uVar9 >> (0x7eU - cVar5 & 0x1f),
               0x80000000 < uVar9 << (cVar5 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | uVar9 | (uint)(uVar9 == 0);
            }
          }
          *(uint16_t *)((long)&pRVar1[uVar10].b._h + lVar11) = (uint16_t)uVar7;
          fVar13 = (*(float *)(_imath_half_to_float_table +
                              (ulong)*(uint16_t *)((long)&pRVar1[uVar10].r._h + lVar11) * 4) +
                    *(float *)(_imath_half_to_float_table + (ulong)(uVar7 & 0xffff) * 4) +
                   *(float *)(_imath_half_to_float_table +
                             (ulong)*(uint16_t *)((long)&pRVar1[uVar10].g._h + lVar11) * 4)) / 3.0;
          fVar8 = ABS(fVar13);
          uVar6 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar7 = (uint)fVar8 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar8 >> 0x17),
               uVar6 = uVar6 | (ushort)(uVar7 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar7 << (cVar5 + 0xa2U & 0x1f))) {
              uVar6 = uVar6 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar6 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar6;
            }
            else {
              uVar6 = uVar6 | 0x7c00;
            }
          }
          else {
            uVar6 = uVar6 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar7 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar6 = uVar6 | (ushort)uVar7 | (ushort)(uVar7 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar10].a._h + lVar11) = uVar6;
          uVar10 = uVar10 + 1;
        } while ((uint)w != uVar10);
      }
      local_60 = local_60 + 1;
      lVar12 = lVar12 + 8;
    } while (local_60 != (uint)h);
  }
  return;
}

Assistant:

void
fillPixels (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = 0.5 + 0.5 * sin (0.1 * x + 0.1 * y);
            p.g = 0.5 + 0.5 * sin (0.1 * x + 0.2 * y);
            p.b = 0.5 + 0.5 * sin (0.1 * x + 0.3 * y);
            p.a = (p.r + p.b + p.g) / 3.0;
        }
    }
}